

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  uint ssize;
  ulong uVar4;
  value_type vVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = (((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts;
  ssize = (((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)ssize < (int)uVar1) {
    ssize = uVar1;
  }
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar2 = (this->dx_).ptr_to_data;
    if (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts == 0)) {
      uVar3 = 0;
      uVar4 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        vVar5 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar3);
        pdVar2[uVar3] = vVar5;
      }
    }
    else {
      uVar3 = 0;
      uVar4 = (ulong)ssize;
      if ((int)ssize < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        vVar5 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar3);
        pdVar2[uVar3] = vVar5;
      }
    }
  }
  dVar6 = sin((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar7 = sin((((fadexpr->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar7 * dVar6;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}